

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c0738::DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test::
~DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test
          (DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test *this)

{
  DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test *this_local;
  
  ~DebugCounterTest_MacroProvidesReportAtExitDependingOnBuild_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DebugCounterTest, MacroProvidesReportAtExitDependingOnBuild) {
#if defined(PROTOBUF_INTERNAL_ENABLE_DEBUG_COUNTERS)
  constexpr bool match_output = true;
#else
  constexpr bool match_output = false;

  // and test that the operations have no side effects.
  static_assert((PROTOBUF_DEBUG_COUNTER("Foo.Bar").Inc(), true), "");
#endif

  EXPECT_EXIT(
      {
        PROTOBUF_DEBUG_COUNTER("Foo.Bar").Inc();
        for (int i = 0; i < 2; ++i) {
          PROTOBUF_DEBUG_COUNTER("Foo.Baz").Inc();
        }
        for (int i = 0; i < 3; ++i) {
          PROTOBUF_DEBUG_COUNTER("Num.32").Inc();
        }
        PROTOBUF_DEBUG_COUNTER("Num.128").Inc();
        exit(0);
      },
      ExitedWithCode(0), MatchOutput(match_output));
}